

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall
SkylineBinPack::Insert
          (SkylineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  RectSize *pRVar4;
  Rect RVar5;
  undefined1 local_70 [16];
  uint local_60;
  int local_5c;
  int index;
  int score2;
  int score1;
  Rect newNode;
  uint i;
  int bestRectIndex;
  int bestSkylineIndex;
  int bestScore2;
  int bestScore1;
  Rect bestNode;
  TArray<Rect,_Rect> *dst_local;
  TArray<RectSize,_RectSize> *rects_local;
  SkylineBinPack *this_local;
  
  bestNode._8_8_ = dst;
  TArray<Rect,_Rect>::Clear(dst);
  while( true ) {
    uVar3 = TArray<RectSize,_RectSize>::Size(rects);
    if (uVar3 == 0) {
      return;
    }
    bestSkylineIndex = 0x7fffffff;
    bestRectIndex = 0x7fffffff;
    i = 0xffffffff;
    newNode.height = -1;
    for (newNode.width = 0; iVar1 = newNode.width, uVar3 = TArray<RectSize,_RectSize>::Size(rects),
        (uint)iVar1 < uVar3; newNode.width = newNode.width + 1) {
      pRVar4 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)newNode.width);
      iVar1 = pRVar4->width;
      pRVar4 = TArray<RectSize,_RectSize>::operator[](rects,(ulong)(uint)newNode.width);
      RVar5 = FindPositionForNewNodeMinWaste
                        (this,iVar1,pRVar4->height,&local_5c,&index,(int *)&local_60);
      local_70._0_8_ = RVar5._0_8_;
      score2 = local_70._0_4_;
      score1 = local_70._4_4_;
      local_70._8_8_ = RVar5._8_8_;
      newNode.x = local_70._8_4_;
      newNode.y = local_70._12_4_;
      bVar2 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&score2);
      if (!bVar2) {
        __assert_fail("disjointRects.Disjoint(newNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x49,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
      }
      if ((newNode.y != 0) &&
         ((index < bestSkylineIndex || ((index == bestSkylineIndex && (local_5c < bestRectIndex)))))
         ) {
        bestScore2 = score2;
        bestScore1 = score1;
        bestNode.x = newNode.x;
        bestNode.y = newNode.y;
        bestSkylineIndex = index;
        bestRectIndex = local_5c;
        i = local_60;
        newNode.height = newNode.width;
      }
    }
    if (newNode.height == -1) break;
    bVar2 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&bestScore2);
    if (!bVar2) {
      __assert_fail("disjointRects.Disjoint(bestNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0x5d,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
    }
    DisjointRectCollection::Add(&this->disjointRects,(Rect *)&bestScore2);
    AddSkylineLevel(this,i,(Rect *)&bestScore2);
    pRVar4 = TArray<RectSize,_RectSize>::operator[](rects,(long)newNode.height);
    iVar1 = pRVar4->width;
    pRVar4 = TArray<RectSize,_RectSize>::operator[](rects,(long)newNode.height);
    this->usedSurfaceArea = (long)(iVar1 * pRVar4->height) + this->usedSurfaceArea;
    TArray<RectSize,_RectSize>::Delete(rects,newNode.height);
    TArray<Rect,_Rect>::Push((TArray<Rect,_Rect> *)bestNode._8_8_,(Rect *)&bestScore2);
  }
  return;
}

Assistant:

void SkylineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst)
{
	dst.Clear();

	while(rects.Size() > 0)
	{
		Rect bestNode;
		int bestScore1 = INT_MAX;
		int bestScore2 = INT_MAX;
		int bestSkylineIndex = -1;
		int bestRectIndex = -1;
		for(unsigned i = 0; i < rects.Size(); ++i)
		{
			Rect newNode;
			int score1;
			int score2;
			int index;
			newNode = FindPositionForNewNodeMinWaste(rects[i].width, rects[i].height, score2, score1, index);
#ifdef _DEBUG
			assert(disjointRects.Disjoint(newNode));
#endif
			if (newNode.height != 0)
			{
				if (score1 < bestScore1 || (score1 == bestScore1 && score2 < bestScore2))
				{
					bestNode = newNode;
					bestScore1 = score1;
					bestScore2 = score2;
					bestSkylineIndex = index;
					bestRectIndex = i;
				}
			}
		}

		if (bestRectIndex == -1)
			return;

		// Perform the actual packing.
#ifdef _DEBUG
		assert(disjointRects.Disjoint(bestNode));
		disjointRects.Add(bestNode);
#endif
		AddSkylineLevel(bestSkylineIndex, bestNode);
		usedSurfaceArea += rects[bestRectIndex].width * rects[bestRectIndex].height;
		rects.Delete(bestRectIndex);
		dst.Push(bestNode);
	}
}